

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase339::run(TestCase339 *this)

{
  bool bVar1;
  char *in_RCX;
  char (*in_RDX) [4];
  char (*extraout_RDX) [8];
  char (*extraout_RDX_00) [8];
  char (*text) [8];
  char (*extraout_RDX_01) [8];
  char (*extraout_RDX_02) [3];
  char (*extraout_RDX_03) [3];
  char (*text_00) [3];
  char (*extraout_RDX_04) [3];
  char (*extraout_RDX_05) [11];
  char (*extraout_RDX_06) [11];
  char (*text_01) [11];
  char (*extraout_RDX_07) [11];
  char (*extraout_RDX_08) [10];
  char (*extraout_RDX_09) [10];
  char (*text_02) [10];
  char (*extraout_RDX_10) [10];
  char (*text_03) [8];
  char (*text_04) [7];
  char (*text_05) [9];
  char (*text_06) [6];
  char (*text_07) [8];
  char (*text_08) [5];
  DecodeUriOptions options_00;
  char *in_R8;
  ArrayPtr<const_char> text_09;
  ArrayPtr<const_char> text_10;
  bool local_26b;
  undefined1 auStack_268 [5];
  bool _kj_shouldLog_5;
  String local_258;
  ArrayPtr<const_char> local_240;
  EncodingResult<kj::Array<unsigned_char>_> local_230;
  DecodeUriOptions local_20e;
  uchar local_20c [4];
  undefined1 local_208 [2];
  DecodeUriOptions options;
  byte bytes [3];
  EncodingResult<kj::String> local_1e8;
  EncodingResult<kj::String> local_1c8;
  EncodingResult<kj::String> local_1a8;
  EncodingResult<kj::String> local_188;
  EncodingResult<kj::String> local_168;
  EncodingResult<kj::String> local_148;
  bool local_121;
  undefined1 local_120 [7];
  bool _kj_shouldLog_4;
  String local_110;
  bool local_f1;
  undefined1 local_f0 [7];
  bool _kj_shouldLog_3;
  StringPtr local_e0;
  ArrayPtr<const_char> local_d0;
  String local_c0;
  bool local_a1;
  undefined1 local_a0 [7];
  bool _kj_shouldLog_2;
  String local_90;
  bool local_71;
  undefined1 local_70 [7];
  bool _kj_shouldLog_1;
  String local_60;
  bool local_45;
  bool _kj_shouldLog;
  StringPtr local_38;
  String local_28;
  TestCase339 *local_10;
  TestCase339 *this_local;
  
  local_10 = this;
  encodeWwwForm<4ul>(&local_28,(kj *)0x654402,in_RDX);
  StringPtr::StringPtr(&local_38,"foo");
  bVar1 = String::operator==(&local_28,&local_38);
  String::~String(&local_28);
  text = extraout_RDX;
  if (!bVar1) {
    local_45 = _::Debug::shouldLog(ERROR);
    text = extraout_RDX_00;
    while (local_45 != false) {
      in_RCX = "\"failed: expected \" \"encodeWwwForm(\\\"foo\\\") == \\\"foo\\\"\"";
      in_R8 = "failed: expected encodeWwwForm(\"foo\") == \"foo\"";
      _::Debug::log<char_const(&)[47]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/encoding-test.c++"
                 ,0x154,ERROR,"\"failed: expected \" \"encodeWwwForm(\\\"foo\\\") == \\\"foo\\\"\"",
                 (char (*) [47])"failed: expected encodeWwwForm(\"foo\") == \"foo\"");
      text = extraout_RDX_01;
      local_45 = false;
    }
  }
  encodeWwwForm<8ul>(&local_60,(kj *)0x651bb8,text);
  StringPtr::StringPtr((StringPtr *)local_70,"foo+bar");
  bVar1 = String::operator==(&local_60,(StringPtr *)local_70);
  String::~String(&local_60);
  text_00 = extraout_RDX_02;
  if (!bVar1) {
    local_71 = _::Debug::shouldLog(ERROR);
    text_00 = extraout_RDX_03;
    while (local_71 != false) {
      in_RCX = "\"failed: expected \" \"encodeWwwForm(\\\"foo bar\\\") == \\\"foo+bar\\\"\"";
      in_R8 = "failed: expected encodeWwwForm(\"foo bar\") == \"foo+bar\"";
      _::Debug::log<char_const(&)[55]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/encoding-test.c++"
                 ,0x155,ERROR,
                 "\"failed: expected \" \"encodeWwwForm(\\\"foo bar\\\") == \\\"foo+bar\\\"\"",
                 (char (*) [55])"failed: expected encodeWwwForm(\"foo bar\") == \"foo+bar\"");
      text_00 = extraout_RDX_04;
      local_71 = false;
    }
  }
  encodeWwwForm<3ul>(&local_90,(kj *)anon_var_dwarf_c22f2,text_00);
  StringPtr::StringPtr((StringPtr *)local_a0,"%AB%BA");
  bVar1 = String::operator==(&local_90,(StringPtr *)local_a0);
  String::~String(&local_90);
  if (!bVar1) {
    local_a1 = _::Debug::shouldLog(ERROR);
    while (local_a1 != false) {
      in_RCX = "\"failed: expected \" \"encodeWwwForm(\\\"\\\\xab\\\\xba\\\") == \\\"%AB%BA\\\"\"";
      in_R8 = "failed: expected encodeWwwForm(\"\\xab\\xba\") == \"%AB%BA\"";
      _::Debug::log<char_const(&)[55]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/encoding-test.c++"
                 ,0x156,ERROR,
                 "\"failed: expected \" \"encodeWwwForm(\\\"\\\\xab\\\\xba\\\") == \\\"%AB%BA\\\"\""
                 ,(char (*) [55])"failed: expected encodeWwwForm(\"\\xab\\xba\") == \"%AB%BA\"");
      local_a1 = false;
    }
  }
  StringPtr::StringPtr(&local_e0,"foo",7);
  local_d0 = StringPtr::operator_cast_to_ArrayPtr(&local_e0);
  text_09.size_ = (size_t)in_RCX;
  text_09.ptr = (char *)local_d0.size_;
  encodeWwwForm(&local_c0,(kj *)local_d0.ptr,text_09);
  StringPtr::StringPtr((StringPtr *)local_f0,"foo%00bar");
  bVar1 = String::operator==(&local_c0,(StringPtr *)local_f0);
  String::~String(&local_c0);
  text_01 = extraout_RDX_05;
  if (!bVar1) {
    local_f1 = _::Debug::shouldLog(ERROR);
    text_01 = extraout_RDX_06;
    while (local_f1 != false) {
      in_R8 = "failed: expected encodeWwwForm(StringPtr(\"foo\\0bar\", 7)) == \"foo%00bar\"";
      _::Debug::log<char_const(&)[72]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/encoding-test.c++"
                 ,0x157,ERROR,
                 "\"failed: expected \" \"encodeWwwForm(StringPtr(\\\"foo\\\\0bar\\\", 7)) == \\\"foo%00bar\\\"\""
                 ,(char (*) [72])
                  "failed: expected encodeWwwForm(StringPtr(\"foo\\0bar\", 7)) == \"foo%00bar\"");
      text_01 = extraout_RDX_07;
      local_f1 = false;
    }
  }
  encodeWwwForm<11ul>(&local_110,(kj *)"\'foo\'! (~)",text_01);
  StringPtr::StringPtr((StringPtr *)local_120,"%27foo%27%21+%28%7E%29");
  bVar1 = String::operator==(&local_110,(StringPtr *)local_120);
  String::~String(&local_110);
  options_00 = SUB82(in_R8,0);
  text_02 = extraout_RDX_08;
  if (!bVar1) {
    local_121 = _::Debug::shouldLog(ERROR);
    text_02 = extraout_RDX_09;
    while (options_00 = SUB82(in_R8,0), local_121 != false) {
      in_R8 = "failed: expected encodeWwwForm(\"\'foo\'! (~)\") == \"%27foo%27%21+%28%7E%29\"";
      _::Debug::log<char_const(&)[73]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/encoding-test.c++"
                 ,0x15a,ERROR,
                 "\"failed: expected \" \"encodeWwwForm(\\\"\'foo\'! (~)\\\") == \\\"%27foo%27%21+%28%7E%29\\\"\""
                 ,(char (*) [73])
                  "failed: expected encodeWwwForm(\"\'foo\'! (~)\") == \"%27foo%27%21+%28%7E%29\"");
      text_02 = extraout_RDX_10;
      local_121 = false;
    }
  }
  decodeWwwForm<10ul>(&local_148,(kj *)"foo%20bar",text_02);
  (anonymous_namespace)::expectRes<kj::String,char,8ul>(&local_148,(char (*) [8])0x651bb8,false);
  EncodingResult<kj::String>::~EncodingResult(&local_148);
  decodeWwwForm<8ul>(&local_168,(kj *)"foo+bar",text_03);
  (anonymous_namespace)::expectRes<kj::String,char,8ul>(&local_168,(char (*) [8])0x651bb8,false);
  EncodingResult<kj::String>::~EncodingResult(&local_168);
  decodeWwwForm<7ul>(&local_188,(kj *)"%ab%BA",text_04);
  (anonymous_namespace)::expectRes<kj::String,char,3ul>(&local_188,&anon_var_dwarf_c22f2,false);
  EncodingResult<kj::String>::~EncodingResult(&local_188);
  decodeWwwForm<9ul>(&local_1a8,(kj *)"foo%1xxx",text_05);
  (anonymous_namespace)::expectRes<kj::String,char,8ul>(&local_1a8,(char (*) [8])"foo\x01xxx",true);
  EncodingResult<kj::String>::~EncodingResult(&local_1a8);
  decodeWwwForm<6ul>(&local_1c8,(kj *)"foo%1",text_06);
  (anonymous_namespace)::expectRes<kj::String,char,5ul>(&local_1c8,(char (*) [5])"foo\x01",true);
  EncodingResult<kj::String>::~EncodingResult(&local_1c8);
  decodeWwwForm<8ul>(&local_1e8,(kj *)"foo%xxx",text_07);
  (anonymous_namespace)::expectRes<kj::String,char,7ul>(&local_1e8,(char (*) [7])"fooxxx",true);
  EncodingResult<kj::String>::~EncodingResult(&local_1e8);
  decodeWwwForm<5ul>((EncodingResult<kj::String> *)local_208,(kj *)"foo%",text_08);
  (anonymous_namespace)::expectRes<kj::String,char,4ul>
            ((EncodingResult<kj::String> *)local_208,(char (*) [4])0x654402,true);
  EncodingResult<kj::String>::~EncodingResult((EncodingResult<kj::String> *)local_208);
  local_20c[2] = '8';
  local_20c[0] = '\f';
  local_20c[1] = '\"';
  DecodeUriOptions::DecodeUriOptions(&local_20e,false,true);
  ArrayPtr<unsigned_char_const>::ArrayPtr<3ul>
            ((ArrayPtr<unsigned_char_const> *)auStack_268,(uchar (*) [3])local_20c);
  encodeWwwForm(&local_258,_auStack_268);
  local_240 = String::operator_cast_to_ArrayPtr(&local_258);
  text_10.ptr = local_240.size_;
  text_10.size_._0_2_ = local_20e;
  text_10.size_._2_6_ = 0;
  decodeBinaryUriComponent(&local_230,(kj *)local_240.ptr,text_10,options_00);
  bVar1 = Array<unsigned_char>::operator==
                    (&local_230.super_Array<unsigned_char>,(uchar (*) [3])local_20c);
  EncodingResult<kj::Array<unsigned_char>_>::~EncodingResult(&local_230);
  String::~String(&local_258);
  if (!bVar1) {
    local_26b = _::Debug::shouldLog(ERROR);
    while (local_26b != false) {
      _::Debug::log<char_const(&)[82]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/encoding-test.c++"
                 ,0x168,ERROR,
                 "\"failed: expected \" \"decodeBinaryUriComponent(encodeWwwForm(bytes), options) == bytes\""
                 ,(char (*) [82])
                  "failed: expected decodeBinaryUriComponent(encodeWwwForm(bytes), options) == bytes"
                );
      local_26b = false;
    }
  }
  return;
}

Assistant:

TEST(Async, SeparateFulfillerCanceled) {
  auto pair = newPromiseAndFulfiller<void>();

  EXPECT_TRUE(pair.fulfiller->isWaiting());
  pair.promise = nullptr;
  EXPECT_FALSE(pair.fulfiller->isWaiting());
}